

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

void __thiscall
t_go_generator::generate_deserialize_struct
          (t_go_generator *this,ostream *out,t_struct *tstruct,bool pointer_field,bool declare,
          string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined3 in_register_00000081;
  string eq;
  string local_70;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  pcVar3 = " = ";
  if (CONCAT31(in_register_00000081,declare) != 0) {
    pcVar3 = " := ";
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar3,pcVar3 + (ulong)CONCAT31(in_register_00000081,declare) + 3);
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_50,local_48);
  pcVar3 = "";
  if (pointer_field) {
    pcVar3 = "&";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,(ulong)pointer_field);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  generate_go_struct_initializer(this,out,tstruct,false);
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if err := ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->read_method_name_)._M_dataplus._M_p,
                      (this->read_method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(ctx, iprot); err != nil {",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"  return thrift.PrependError(fmt.Sprintf(\"%T error reading struct: \", ",0x46)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), err)",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void t_go_generator::generate_deserialize_struct(ostream& out,
                                                 t_struct* tstruct,
                                                 bool pointer_field,
                                                 bool declare,
                                                 string prefix) {
  string eq(declare ? " := " : " = ");

  out << indent() << prefix << eq << (pointer_field ? "&" : "");
  generate_go_struct_initializer(out, tstruct);
  out << indent() << "if err := " << prefix << "." << read_method_name_ <<  "(ctx, iprot); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T error reading struct: \", "
      << prefix << "), err)" << endl;
  out << indent() << "}" << endl;
}